

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false>::
SetPropertyFromDescriptor<true,int>
          (SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false> *this,
          DynamicObject *instance,PropertyId propertyId,int propertyKey,
          SimpleDictionaryPropertyDescriptor<int> *descriptor,Var value,PropertyOperationFlags flags
          ,PropertyValueInfo *info)

{
  Type *pTVar1;
  undefined8 *puVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  PropertyRecord **ppPVar8;
  PropertyRecord *pPVar9;
  UndeclaredBlockVariable *pUVar10;
  SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *pSVar11;
  PropertyRecord *pPVar12;
  DynamicObject *pDVar13;
  Var aValue;
  int local_64;
  Var pvStack_60;
  int propertyIndex;
  PropertyValueInfo *local_58;
  int local_4c;
  ScriptContext *local_48;
  DynamicObject *local_40;
  PropertyOperationFlags local_34;
  
  local_34 = flags;
  pvStack_60 = value;
  local_4c = propertyId;
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    local_40 = instance;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x526,"(instance)","instance");
    if (!bVar4) goto LAB_00e3d219;
    *puVar7 = 0;
    instance = local_40;
  }
  pTVar1 = (instance->super_RecyclableObject).type.ptr;
  local_48 = (((pTVar1->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  if ((descriptor->Attributes & 8) == 0) {
    if ((local_34 & PropertyOperation_AllowUndeclInConsoleScope) == PropertyOperation_None &&
        (descriptor->Attributes & 4) == 0) {
      JavascriptError::ThrowCantAssignIfStrictMode(local_34,local_48);
      if (info == (PropertyValueInfo *)0x0) {
        return 0;
      }
      info->m_instance = &instance->super_RecyclableObject;
      info->m_propertyIndex = 0xffff;
      info->m_attributes = '\0';
      info->flags = InlineCacheNoFlags;
      return 0;
    }
  }
  else {
    if (((byte)this[9] & 4) != 0) {
      pSVar11 = SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>::
                ConvertToNonSharedSimpleDictionaryType
                          ((SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>
                            *)this,instance);
      iVar5 = (*(pSVar11->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x17])
                        (pSVar11,instance,(ulong)(uint)propertyKey,pvStack_60,(ulong)local_34,info);
      return iVar5;
    }
    if (*(char *)&pTVar1[1].javascriptLibrary.ptr == '\x01') {
      if ((((byte)this[9] & 0x10) != 0) ||
         (*(char *)((long)&pTVar1[1].javascriptLibrary.ptr + 1) == '\x01')) {
        AssertCount = AssertCount + 1;
        local_40 = instance;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x547,
                                    "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())"
                                    ,"!GetIsShared() && !instance->GetDynamicType()->GetIsShared()")
        ;
        if (!bVar4) goto LAB_00e3d219;
        *puVar7 = 0;
        instance = local_40;
      }
      DynamicObject::ChangeType(instance);
    }
    if ((((byte)this[0x28] & 2) != 0) &&
       (bVar4 = SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false>::
                TryUndeleteProperty((SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false>
                                     *)this,instance,descriptor->propertyIndex,&local_64), bVar4)) {
      ppPVar8 = JsUtil::
                BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                ::GetKeyAt(*(BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                             **)(this + 0x18),local_64);
      pPVar12 = *ppPVar8;
      pPVar9 = ScriptContext::GetPropertyName(local_48,propertyKey);
      if (pPVar12 != pPVar9) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x55e,
                                    "(PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey)))"
                                    ,
                                    "PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey))"
                                   );
        if (!bVar4) goto LAB_00e3d219;
        *puVar7 = 0;
      }
      descriptor = JsUtil::
                   BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                   ::GetReferenceAt(*(BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                                      **)(this + 0x18),local_64);
    }
    bVar4 = SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>::
            SupportsSwitchingToUnordered
                      ((SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *)
                       this,local_48);
    if (bVar4) {
      this[0x29] = (SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false>)
                   ((char)this[0x29] + -1);
    }
    descriptor->Attributes = '\a';
    DynamicObject::SetHasNoEnumerableProperties(instance,false);
    if (propertyKey != -1) {
      ScriptContext::InvalidateProtoCaches(local_48,propertyKey);
    }
    descriptor->Attributes = '\a';
    local_4c = propertyKey;
  }
  if (descriptor->propertyIndex != -1) {
    if ((((-1 < (char)(undefined1)local_34) && (0x3f < descriptor->Attributes)) &&
        (pUVar10 = (UndeclaredBlockVariable *)
                   DynamicObject::GetSlot(instance,descriptor->propertyIndex),
        (local_34 >> 8 & 1) == 0)) &&
       ((((local_48->super_ScriptContextBase).javascriptLibrary)->undeclBlockVarSentinel).ptr ==
        pUVar10)) {
      JavascriptError::ThrowReferenceError(local_48,-0x7ff5ec07,(PCWSTR)0x0);
    }
    puVar2 = *(undefined8 **)(this + 0x20);
    if (puVar2 == (undefined8 *)0x0) {
      pDVar13 = (DynamicObject *)0x0;
    }
    else {
      pDVar13 = (DynamicObject *)*puVar2;
    }
    local_40 = (DynamicObject *)this;
    if (pDVar13 != instance && puVar2 != (undefined8 *)0x0) {
      local_58 = info;
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x588,
                                  "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                  ,
                                  "this->singletonInstance == nullptr || localSingletonInstance == instance"
                                 );
      if (!bVar4) goto LAB_00e3d219;
      *puVar7 = 0;
      info = local_58;
    }
    aValue = pvStack_60;
    if ((*(byte *)descriptor & 2) == 0) {
      if ((((local_34 & PropertyOperation_PreInit) == PropertyOperation_None) &&
          (*(byte *)descriptor = *(byte *)descriptor | 2, pDVar13 == instance)) &&
         ((local_34 & (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) ==
          PropertyOperation_None && 0xf < (uint)propertyKey)) {
        if (((ulong)(local_40->super_RecyclableObject).type.ptr & 0x1000) != 0) {
          AssertCount = AssertCount + 1;
          local_58 = info;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                      ,0x594,"(!GetIsShared())","!GetIsShared()");
          if (!bVar4) goto LAB_00e3d219;
          *puVar7 = 0;
          info = local_58;
        }
        if (aValue == (Var)0x0) {
          AssertCount = AssertCount + 1;
          local_58 = info;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                      ,0x595,"(value != nullptr)","value != nullptr");
          if (!bVar4) goto LAB_00e3d219;
          *puVar7 = 0;
          info = local_58;
        }
        BVar6 = RecyclableObject::IsExternal(&instance->super_RecyclableObject);
        if (BVar6 != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                      ,0x597,"(!instance->IsExternal())","!instance->IsExternal()");
          if (!bVar4) {
LAB_00e3d219:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar7 = 0;
          aValue = pvStack_60;
        }
        bVar4 = VarIs<Js::JavascriptFunction>(aValue);
        if (bVar4) {
          bVar4 = Phases::IsEnabled((Phases *)&DAT_015bbe90,FixMethodPropsPhase);
          bVar4 = !bVar4;
        }
        else {
          bVar4 = Phases::IsEnabled((Phases *)&DAT_015bbe90,FixDataPropsPhase);
          if (bVar4) {
            bVar4 = false;
          }
          else {
            bVar4 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps(instance,local_4c,aValue);
          }
        }
        *(byte *)descriptor = *(byte *)descriptor & 0xfb | bVar4 << 2;
      }
    }
    else {
      pPVar12 = ScriptContext::GetPropertyName(local_48,propertyKey);
      InvalidateFixedField<Js::PropertyRecord_const*>
                ((SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false> *)local_40,
                 pPVar12,descriptor,
                 (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                 super_JavascriptLibraryBase).scriptContext.ptr);
    }
    DynamicTypeHandler::SetSlotUnchecked(instance,descriptor->propertyIndex,pvStack_60);
    this = (SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false> *)local_40;
    if (info != (PropertyValueInfo *)0x0) {
      info->m_instance = &instance->super_RecyclableObject;
      info->m_propertyIndex = 0xffff;
      info->m_attributes = '\0';
      info->flags = InlineCacheNoFlags;
    }
  }
  TPropertyKey_GetUpdateSideEffectPropertyId<int>(local_4c,propertyKey);
  if (propertyKey != -1) {
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              ((DynamicTypeHandler *)this,instance,propertyKey,pvStack_60,SideEffects_Any);
  }
  return 1;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetPropertyFromDescriptor(DynamicObject* instance, PropertyId propertyId, TPropertyKey propertyKey, SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        Assert(instance);
        ScriptContext* scriptContext = instance->GetScriptContext();
        bool throwIfNotExtensible = (flags & (PropertyOperation_ThrowIfNotExtensible | PropertyOperation_StrictMode)) != 0;

        if (!allowLetConstGlobal && (descriptor->Attributes & PropertyLetConstGlobal))
        {
            // We have a shadowing case here.  An undeclared global property
            // is being added after a let/const was already declared.
            //
            // SimpleDictionaryTypeHandlerBase does not handle shadowed globals
            // because we do not want to add another property index field to the
            // property descriptors.  Instead convert to DictionaryTypeHandler
            // where it will reuse one of the getter/setter fields on its
            // property descriptor type.
            return
                ConvertToDictionaryType(instance)
                    ->SetProperty(
                            instance,
                            propertyId,
                            value,
                            flags,
                            info);
        }

        if (descriptor->Attributes & PropertyDeleted)
        {
            if(GetIsLocked())
            {
                return
                    ConvertToNonSharedSimpleDictionaryType(instance)->SetProperty(instance, propertyKey, value, flags, info);
            }
            else if (instance->GetDynamicType()->GetIsLocked())
            {
                Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                instance->ChangeType();
            }

            if (IsNotExtensibleSupported)
            {
                bool isForce = (flags & PropertyOperation_Force) != 0;
                if (!isForce)
                {
                    if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
                    {
                        return FALSE;
                    }
                }
            }

            if(isUnordered)
            {
                TPropertyIndex propertyIndex;
                if(AsUnordered()->TryUndeleteProperty(instance, descriptor->propertyIndex, &propertyIndex))
                {
                    Assert(PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey)));
                    descriptor = propertyMap->GetReferenceAt(propertyIndex);
                }
            }

            if(SupportsSwitchingToUnordered(scriptContext))
            {
                --numDeletedProperties;
            }
            descriptor->Attributes = PropertyDynamicTypeDefaults;
            instance->SetHasNoEnumerableProperties(false);
            propertyId = TPropertyKey_GetOptionalPropertyId(instance->GetScriptContext(), propertyKey);
            if (propertyId != Constants::NoProperty)
            {
                scriptContext->InvalidateProtoCaches(propertyId);
            }
            descriptor->Attributes = PropertyDynamicTypeDefaults;
        }
        else if (!(descriptor->Attributes & PropertyWritable) && !(flags & PropertyOperation_AllowUndeclInConsoleScope))
        {
            JavascriptError::ThrowCantAssignIfStrictMode(flags, scriptContext);

            // Since we separate LdFld and StFld caches there is no point in caching for StFld with non-writable properties, except perhaps
            // to prepopulate the type property cache (which we do share between LdFld and StFld), for potential future field loads. This
            // would require additional handling in CacheOperators::CachePropertyWrite, such that for !info-IsWritable() we don't populate
            // the local cache (that would be illegal), but still populate the type's property cache.
            PropertyValueInfo::SetNoCache(info, instance);
            return false;
        }

        if (descriptor->propertyIndex != NoSlots)
        {
            if ((descriptor->Attributes & PropertyNoRedecl) && !(flags & PropertyOperation_AllowUndecl))
            {
                if (scriptContext->IsUndeclBlockVar(instance->GetSlot(descriptor->propertyIndex)) && !(flags & PropertyOperation_AllowUndeclInConsoleScope))
                {
                    JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
                }
            }

#if ENABLE_FIXED_FIELDS
            DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
            Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);
            if (!descriptor->isInitialized)
            {
                if ((flags & PropertyOperation_PreInit) == 0)
                {
                    // Consider: It would be nice to assert the slot is actually null.  However, we sometimes pre-initialize to undefined or even
                    // some other special illegal value (for let or const), currently == null.
                    descriptor->isInitialized = true;
                    if (localSingletonInstance == instance &&
                        !TPropertyKey_IsInternalPropertyId(propertyKey) &&
                        (flags & (PropertyOperation_NonFixedValue | PropertyOperation_SpecialValue)) == 0)
                    {
                        Assert(!GetIsShared());
                        Assert(value != nullptr);
                        // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                        Assert(!instance->IsExternal());
                        descriptor->isFixed = (VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyId, value)));
                    }
                }
            }
            else
            {
                InvalidateFixedField(TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey), descriptor, instance->GetScriptContext());
            }
#endif

            SetSlotUnchecked(instance, descriptor->propertyIndex, value);

            if (!descriptor->IsOrMayBecomeFixed())
            {
                SetPropertyValueInfoNonFixed(info, instance, descriptor->propertyIndex, descriptor->Attributes);
            }
            else
            {
                PropertyValueInfo::SetNoCache(info, instance);
            }
        }

        propertyId = TPropertyKey_GetUpdateSideEffectPropertyId(propertyId, propertyKey);
        if (propertyId != Constants::NoProperty)
        {
            SetPropertyUpdateSideEffect(instance, propertyId, value, SideEffects_Any);
        }
        return true;
    }